

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

void Cgt_ManDetectFanout(Aig_Man_t *pAig,Aig_Obj_t *pObj,int nOdcMax,Vec_Ptr_t *vFanout)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  vFanout->nSize = 0;
  Aig_ManIncrementTravId(pAig);
  Cgt_ManDetectFanout_rec(pAig,pObj,nOdcMax,vFanout);
  uVar1 = vFanout->nSize;
  if ((long)(int)uVar1 < 1) {
    uVar3 = 0;
  }
  else {
    lVar4 = 0;
    uVar6 = 0xffffffff;
    uVar3 = 0;
    do {
      if (pAig->pFanData == (int *)0x0) {
        __assert_fail("pAig->pFanData",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                      ,0x80,"void Cgt_ManDetectFanout(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
      }
      pvVar2 = vFanout->pArray[lVar4];
      uVar8 = *(uint *)((long)pvVar2 + 0x18) >> 6;
      uVar11 = 0;
      if (0x3f < *(uint *)((long)pvVar2 + 0x18)) {
        uVar5 = uVar8 + (uVar8 == 0);
        uVar10 = 0;
        do {
          if (uVar10 == 0) {
            if (pAig->nFansAlloc <= *(int *)((long)pvVar2 + 0x24)) {
              __assert_fail("ObjId < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
            }
            iVar7 = *(int *)((long)pvVar2 + 0x24) * 5;
          }
          else {
            if (pAig->nFansAlloc <= (int)uVar6 / 2) {
              __assert_fail("iFan/2 < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
            }
            iVar7 = (uVar6 & 1) + ((int)uVar6 >> 1) * 5 + 3;
          }
          uVar6 = pAig->pFanData[iVar7];
          uVar12 = (int)uVar6 >> 1;
          if (((int)uVar12 < 0) || (pAig->vObjs->nSize <= (int)uVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar11 = uVar10;
        } while ((*(int *)((long)pAig->vObjs->pArray[uVar12] + 0x20) == pAig->nTravIds) &&
                (uVar10 = uVar10 + 1, uVar11 = uVar5, uVar5 != uVar10));
      }
      if (uVar11 != uVar8) {
        if (uVar1 <= uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar9 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        vFanout->pArray[uVar9] = pvVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != (int)uVar1);
  }
  if ((int)uVar1 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  vFanout->nSize = uVar3;
  if (1 < (int)uVar3) {
    qsort(vFanout->pArray,(ulong)uVar3,8,Aig_ObjCompareIdIncrease);
  }
  if (vFanout->nSize < 1) {
    __assert_fail("Vec_PtrSize(vFanout) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                  ,0x89,"void Cgt_ManDetectFanout(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Cgt_ManDetectFanout( Aig_Man_t * pAig, Aig_Obj_t * pObj, int nOdcMax, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int i, k, f, iFanout = -1;
    // collect visited nodes
    Vec_PtrClear( vFanout );
    Aig_ManIncrementTravId( pAig );
    Cgt_ManDetectFanout_rec( pAig, pObj, nOdcMax, vFanout );
    // remove those nodes whose fanout is included
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
    {
        // go through the fanouts of this node
        Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
            if ( !Aig_ObjIsTravIdCurrent(pAig, pFanout) )
                break;
        if ( f == Aig_ObjRefs(pObj) ) // all fanouts are included
            continue;
        Vec_PtrWriteEntry( vFanout, k++, pObj );
    }
    Vec_PtrShrink( vFanout, k );
    Vec_PtrSort( vFanout, (int (*)(void))Aig_ObjCompareIdIncrease );
    assert( Vec_PtrSize(vFanout) > 0 );
}